

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlCtxtResetPush(xmlParserCtxtPtr ctxt,char *chunk,int size,char *filename,char *encoding)

{
  xmlChar *pxVar1;
  xmlParserInputBufferPtr in;
  char *pcVar2;
  xmlParserInputPtr input;
  size_t base_00;
  xmlChar *pxVar3;
  xmlCharEncodingHandlerPtr handler;
  xmlCharEncodingHandlerPtr hdlr;
  size_t cur;
  size_t base;
  xmlCharEncoding enc;
  xmlParserInputBufferPtr buf;
  xmlParserInputPtr inputStream;
  char *encoding_local;
  char *filename_local;
  int size_local;
  char *chunk_local;
  xmlParserCtxtPtr ctxt_local;
  
  base._4_4_ = XML_CHAR_ENCODING_NONE;
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt_local._4_4_ = 1;
  }
  else {
    if (((encoding == (char *)0x0) && (chunk != (char *)0x0)) && (3 < size)) {
      base._4_4_ = xmlDetectCharEncoding((uchar *)chunk,size);
    }
    in = xmlAllocParserInputBuffer(base._4_4_);
    if (in == (xmlParserInputBufferPtr)0x0) {
      ctxt_local._4_4_ = 1;
    }
    else if (ctxt == (xmlParserCtxtPtr)0x0) {
      xmlFreeParserInputBuffer(in);
      ctxt_local._4_4_ = 1;
    }
    else {
      xmlCtxtReset(ctxt);
      if (filename == (char *)0x0) {
        ctxt->directory = (char *)0x0;
      }
      else {
        pcVar2 = xmlParserGetDirectory(filename);
        ctxt->directory = pcVar2;
      }
      input = xmlNewInputStream(ctxt);
      if (input == (xmlParserInputPtr)0x0) {
        xmlFreeParserInputBuffer(in);
        ctxt_local._4_4_ = 1;
      }
      else {
        if (filename == (char *)0x0) {
          input->filename = (char *)0x0;
        }
        else {
          pxVar3 = xmlCanonicPath((xmlChar *)filename);
          input->filename = (char *)pxVar3;
        }
        input->buf = in;
        xmlBufResetInput(in->buffer,input);
        inputPush(ctxt,input);
        if (((0 < size) && (chunk != (char *)0x0)) &&
           ((ctxt->input != (xmlParserInputPtr)0x0 &&
            (ctxt->input->buf != (xmlParserInputBufferPtr)0x0)))) {
          base_00 = xmlBufGetInputBase(ctxt->input->buf->buffer,ctxt->input);
          pxVar3 = ctxt->input->cur;
          pxVar1 = ctxt->input->base;
          xmlParserInputBufferPush(ctxt->input->buf,size,chunk);
          xmlBufSetInputBaseCur
                    (ctxt->input->buf->buffer,ctxt->input,base_00,(long)pxVar3 - (long)pxVar1);
        }
        if (encoding == (char *)0x0) {
          if (base._4_4_ != XML_CHAR_ENCODING_NONE) {
            xmlSwitchEncoding(ctxt,base._4_4_);
          }
        }
        else {
          if (ctxt->encoding != (xmlChar *)0x0) {
            (*xmlFree)(ctxt->encoding);
          }
          pxVar3 = xmlStrdup((xmlChar *)encoding);
          ctxt->encoding = pxVar3;
          handler = xmlFindCharEncodingHandler(encoding);
          if (handler == (xmlCharEncodingHandlerPtr)0x0) {
            xmlFatalErrMsgStr(ctxt,XML_ERR_UNSUPPORTED_ENCODING,"Unsupported encoding %s\n",
                              (xmlChar *)encoding);
          }
          else {
            xmlSwitchToEncoding(ctxt,handler);
          }
        }
        ctxt_local._4_4_ = 0;
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlCtxtResetPush(xmlParserCtxtPtr ctxt, const char *chunk,
                 int size, const char *filename, const char *encoding)
{
    xmlParserInputPtr inputStream;
    xmlParserInputBufferPtr buf;
    xmlCharEncoding enc = XML_CHAR_ENCODING_NONE;

    if (ctxt == NULL)
        return(1);

    if ((encoding == NULL) && (chunk != NULL) && (size >= 4))
        enc = xmlDetectCharEncoding((const xmlChar *) chunk, size);

    buf = xmlAllocParserInputBuffer(enc);
    if (buf == NULL)
        return(1);

    if (ctxt == NULL) {
        xmlFreeParserInputBuffer(buf);
        return(1);
    }

    xmlCtxtReset(ctxt);

    if (filename == NULL) {
        ctxt->directory = NULL;
    } else {
        ctxt->directory = xmlParserGetDirectory(filename);
    }

    inputStream = xmlNewInputStream(ctxt);
    if (inputStream == NULL) {
        xmlFreeParserInputBuffer(buf);
        return(1);
    }

    if (filename == NULL)
        inputStream->filename = NULL;
    else
        inputStream->filename = (char *)
            xmlCanonicPath((const xmlChar *) filename);
    inputStream->buf = buf;
    xmlBufResetInput(buf->buffer, inputStream);

    inputPush(ctxt, inputStream);

    if ((size > 0) && (chunk != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL)) {
	size_t base = xmlBufGetInputBase(ctxt->input->buf->buffer, ctxt->input);
        size_t cur = ctxt->input->cur - ctxt->input->base;

        xmlParserInputBufferPush(ctxt->input->buf, size, chunk);

        xmlBufSetInputBaseCur(ctxt->input->buf->buffer, ctxt->input, base, cur);
#ifdef DEBUG_PUSH
        xmlGenericError(xmlGenericErrorContext, "PP: pushed %d\n", size);
#endif
    }

    if (encoding != NULL) {
        xmlCharEncodingHandlerPtr hdlr;

        if (ctxt->encoding != NULL)
	    xmlFree((xmlChar *) ctxt->encoding);
        ctxt->encoding = xmlStrdup((const xmlChar *) encoding);

        hdlr = xmlFindCharEncodingHandler(encoding);
        if (hdlr != NULL) {
            xmlSwitchToEncoding(ctxt, hdlr);
	} else {
	    xmlFatalErrMsgStr(ctxt, XML_ERR_UNSUPPORTED_ENCODING,
			      "Unsupported encoding %s\n", BAD_CAST encoding);
        }
    } else if (enc != XML_CHAR_ENCODING_NONE) {
        xmlSwitchEncoding(ctxt, enc);
    }

    return(0);
}